

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O3

void __thiscall
Entity::Entity(Entity *this,uint8_t type_id,uint8_t pos_x,uint8_t pos_y,uint8_t pos_z)

{
  Attributes local_58;
  
  local_58.position.half_x = false;
  local_58.position.half_y = false;
  local_58.position.half_z = false;
  local_58.orientation = '\0';
  local_58.palette = '\x01';
  local_58.behavior_id = 0;
  local_58.speed = '\0';
  local_58.fightable = false;
  local_58.liftable = false;
  local_58.can_pass_through = false;
  local_58.appear_after_player_moved_away = false;
  local_58.gravity_immune = false;
  local_58.talkable = false;
  local_58.dialogue = '\0';
  local_58.entity_to_use_tiles_from = (Entity *)0x0;
  local_58.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_58.persistence_flag.byte = 0xff;
  local_58.persistence_flag.bit = 0xff;
  local_58.flag_unknown_2_3 = false;
  local_58.flag_unknown_2_4 = false;
  local_58.flag_unknown_3_5 = false;
  local_58.type_id = type_id;
  local_58.position.x = pos_x;
  local_58.position.y = pos_y;
  local_58.position.z = pos_z;
  Entity(this,&local_58);
  if (local_58.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

Entity::Entity(uint8_t type_id, uint8_t pos_x, uint8_t pos_y, uint8_t pos_z) :
    Entity({ 
        .type_id = type_id,
        .position = Position(pos_x, pos_y, pos_z)
    })
{}